

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3WhereTabFuncArgs(Parse *pParse,SrcList_item *pItem,WhereClause *pWC)

{
  Table *pTVar1;
  ExprList *pEVar2;
  Expr *pEVar3;
  Expr *pEVar4;
  bool bVar5;
  Expr *pRhs;
  Expr *pTerm;
  Expr *pColRef;
  ExprList *pArgs;
  int k;
  int j;
  Table *pTab;
  WhereClause *pWC_local;
  SrcList_item *pItem_local;
  Parse *pParse_local;
  
  if (((byte)(pItem->fg).field_0x1 >> 2 & 1) != 0) {
    pTVar1 = pItem->pTab;
    pEVar2 = (pItem->u1).pFuncArg;
    if (pEVar2 != (ExprList *)0x0) {
      pArgs._0_4_ = 0;
      for (pArgs._4_4_ = 0; (int)pArgs._4_4_ < pEVar2->nExpr; pArgs._4_4_ = pArgs._4_4_ + 1) {
        while( true ) {
          bVar5 = false;
          if ((int)pArgs < pTVar1->nCol) {
            bVar5 = (pTVar1->aCol[(int)pArgs].colFlags & 2) == 0;
          }
          if (!bVar5) break;
          pArgs._0_4_ = (int)pArgs + 1;
        }
        if (pTVar1->nCol <= (int)pArgs) {
          sqlite3ErrorMsg(pParse,"too many arguments on %s() - max %d",pTVar1->zName,
                          (ulong)pArgs._4_4_);
          return;
        }
        pEVar3 = sqlite3ExprAlloc(pParse->db,0xa2,(Token *)0x0,0);
        if (pEVar3 == (Expr *)0x0) {
          return;
        }
        pEVar3->iTable = pItem->iCursor;
        pEVar3->iColumn = (ynVar)(int)pArgs;
        (pEVar3->y).pTab = pTVar1;
        pEVar4 = sqlite3ExprDup(pParse->db,pEVar2->a[(int)pArgs._4_4_].pExpr,0);
        pEVar4 = sqlite3PExpr(pParse,0xa6,pEVar4,(Expr *)0x0);
        pEVar3 = sqlite3PExpr(pParse,0x35,pEVar3,pEVar4);
        whereClauseInsert(pWC,pEVar3,1);
        pArgs._0_4_ = (int)pArgs + 1;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereTabFuncArgs(
  Parse *pParse,                    /* Parsing context */
  struct SrcList_item *pItem,       /* The FROM clause term to process */
  WhereClause *pWC                  /* Xfer function arguments to here */
){
  Table *pTab;
  int j, k;
  ExprList *pArgs;
  Expr *pColRef;
  Expr *pTerm;
  if( pItem->fg.isTabFunc==0 ) return;
  pTab = pItem->pTab;
  assert( pTab!=0 );
  pArgs = pItem->u1.pFuncArg;
  if( pArgs==0 ) return;
  for(j=k=0; j<pArgs->nExpr; j++){
    Expr *pRhs;
    while( k<pTab->nCol && (pTab->aCol[k].colFlags & COLFLAG_HIDDEN)==0 ){k++;}
    if( k>=pTab->nCol ){
      sqlite3ErrorMsg(pParse, "too many arguments on %s() - max %d",
                      pTab->zName, j);
      return;
    }
    pColRef = sqlite3ExprAlloc(pParse->db, TK_COLUMN, 0, 0);
    if( pColRef==0 ) return;
    pColRef->iTable = pItem->iCursor;
    pColRef->iColumn = k++;
    pColRef->y.pTab = pTab;
    pRhs = sqlite3PExpr(pParse, TK_UPLUS, 
        sqlite3ExprDup(pParse->db, pArgs->a[j].pExpr, 0), 0);
    pTerm = sqlite3PExpr(pParse, TK_EQ, pColRef, pRhs);
    whereClauseInsert(pWC, pTerm, TERM_DYNAMIC);
  }
}